

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost.h
# Opt level: O0

CostType __thiscall wasm::CostAnalyzer::visitUnary(CostAnalyzer *this,Unary *curr)

{
  uint uVar1;
  int local_1c;
  CostType ret;
  Unary *curr_local;
  CostAnalyzer *this_local;
  
  local_1c = 0;
  switch(curr->op) {
  case ClzInt32:
  case ClzInt64:
  case CtzInt32:
  case CtzInt64:
  case PopcntInt32:
  case PopcntInt64:
  case NegFloat32:
  case NegFloat64:
  case AbsFloat32:
  case AbsFloat64:
  case CeilFloat32:
  case CeilFloat64:
  case FloorFloat32:
  case FloorFloat64:
  case TruncFloat32:
  case TruncFloat64:
  case NearestFloat32:
  case NearestFloat64:
  case EqZInt32:
  case EqZInt64:
  case ExtendSInt32:
  case ExtendUInt32:
  case WrapInt64:
  case TruncSFloat32ToInt32:
  case TruncSFloat32ToInt64:
  case TruncUFloat32ToInt32:
  case TruncUFloat32ToInt64:
  case TruncSFloat64ToInt32:
  case TruncSFloat64ToInt64:
  case TruncUFloat64ToInt32:
  case TruncUFloat64ToInt64:
  case ReinterpretFloat32:
  case ReinterpretFloat64:
  case ConvertSInt32ToFloat32:
  case ConvertSInt32ToFloat64:
  case ConvertUInt32ToFloat32:
  case ConvertUInt32ToFloat64:
  case ConvertSInt64ToFloat32:
  case ConvertSInt64ToFloat64:
  case ConvertUInt64ToFloat32:
  case ConvertUInt64ToFloat64:
  case PromoteFloat32:
  case DemoteFloat64:
  case ReinterpretInt32:
  case ReinterpretInt64:
  case ExtendS8Int32:
  case ExtendS16Int32:
  case ExtendS8Int64:
  case ExtendS16Int64:
  case ExtendS32Int64:
  case TruncSatSFloat32ToInt32:
  case TruncSatUFloat32ToInt32:
  case TruncSatSFloat64ToInt32:
  case TruncSatUFloat64ToInt32:
  case TruncSatSFloat32ToInt64:
  case TruncSatUFloat32ToInt64:
  case TruncSatSFloat64ToInt64:
  case TruncSatUFloat64ToInt64:
    local_1c = 1;
    break;
  case SqrtFloat32:
  case SqrtFloat64:
    local_1c = 2;
    break;
  case SplatVecI8x16:
  case SplatVecI16x8:
  case SplatVecI32x4:
  case SplatVecI64x2:
  case SplatVecF32x4:
  case SplatVecF64x2:
  case NotVec128:
  case AnyTrueVec128:
  case AbsVecI8x16:
  case NegVecI8x16:
  case AllTrueVecI8x16:
  case BitmaskVecI8x16:
  case PopcntVecI8x16:
  case AbsVecI16x8:
  case NegVecI16x8:
  case AllTrueVecI16x8:
  case BitmaskVecI16x8:
  case AbsVecI32x4:
  case NegVecI32x4:
  case AllTrueVecI32x4:
  case BitmaskVecI32x4:
  case AbsVecI64x2:
  case NegVecI64x2:
  case AllTrueVecI64x2:
  case BitmaskVecI64x2:
  case AbsVecF16x8:
  case NegVecF16x8:
  case SqrtVecF16x8:
  case CeilVecF16x8:
  case FloorVecF16x8:
  case TruncVecF16x8:
  case NearestVecF16x8:
  case AbsVecF32x4:
  case NegVecF32x4:
  case SqrtVecF32x4:
  case CeilVecF32x4:
  case FloorVecF32x4:
  case TruncVecF32x4:
  case NearestVecF32x4:
  case AbsVecF64x2:
  case NegVecF64x2:
  case SqrtVecF64x2:
  case CeilVecF64x2:
  case FloorVecF64x2:
  case TruncVecF64x2:
  case NearestVecF64x2:
  case ExtAddPairwiseSVecI8x16ToI16x8:
  case ExtAddPairwiseUVecI8x16ToI16x8:
  case ExtAddPairwiseSVecI16x8ToI32x4:
  case ExtAddPairwiseUVecI16x8ToI32x4:
  case TruncSatSVecF32x4ToVecI32x4:
  case TruncSatUVecF32x4ToVecI32x4:
  case ConvertSVecI32x4ToVecF32x4:
  case ConvertUVecI32x4ToVecF32x4:
  case ExtendLowSVecI8x16ToVecI16x8:
  case ExtendHighSVecI8x16ToVecI16x8:
  case ExtendLowUVecI8x16ToVecI16x8:
  case ExtendHighUVecI8x16ToVecI16x8:
  case ExtendLowSVecI16x8ToVecI32x4:
  case ExtendHighSVecI16x8ToVecI32x4:
  case ExtendLowUVecI16x8ToVecI32x4:
  case ExtendHighUVecI16x8ToVecI32x4:
  case ExtendLowSVecI32x4ToVecI64x2:
  case ExtendHighSVecI32x4ToVecI64x2:
  case ExtendLowUVecI32x4ToVecI64x2:
  case ExtendHighUVecI32x4ToVecI64x2:
  case ConvertLowSVecI32x4ToVecF64x2:
  case ConvertLowUVecI32x4ToVecF64x2:
  case TruncSatZeroSVecF64x2ToVecI32x4:
  case TruncSatZeroUVecF64x2ToVecI32x4:
  case DemoteZeroVecF64x2ToVecF32x4:
  case PromoteLowVecF32x4ToVecF64x2:
  case RelaxedTruncSVecF32x4ToVecI32x4:
  case RelaxedTruncUVecF32x4ToVecI32x4:
  case RelaxedTruncZeroSVecF64x2ToVecI32x4:
  case RelaxedTruncZeroUVecF64x2ToVecI32x4:
  case SplatVecF16x8:
  case TruncSatSVecF16x8ToVecI16x8:
  case TruncSatUVecF16x8ToVecI16x8:
  case ConvertSVecI16x8ToVecF16x8:
  case ConvertUVecI16x8ToVecF16x8:
    local_1c = 1;
    break;
  case InvalidUnary:
    handle_unreachable("invalid unary op",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/cost.h"
                       ,0x10f);
  }
  uVar1 = Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
                    ((Visitor<wasm::CostAnalyzer,_unsigned_int> *)this,curr->value);
  return local_1c + uVar1;
}

Assistant:

CostType visitUnary(Unary* curr) {
    CostType ret = 0;
    switch (curr->op) {
      case ClzInt32:
      case CtzInt32:
      case PopcntInt32:
      case NegFloat32:
      case AbsFloat32:
      case CeilFloat32:
      case FloorFloat32:
      case TruncFloat32:
      case NearestFloat32:
      case ClzInt64:
      case CtzInt64:
      case PopcntInt64:
      case NegFloat64:
      case AbsFloat64:
      case CeilFloat64:
      case FloorFloat64:
      case TruncFloat64:
      case NearestFloat64:
      case EqZInt32:
      case EqZInt64:
      case ExtendSInt32:
      case ExtendUInt32:
      case WrapInt64:
      case PromoteFloat32:
      case DemoteFloat64:
      case TruncSFloat32ToInt32:
      case TruncUFloat32ToInt32:
      case TruncSFloat64ToInt32:
      case TruncUFloat64ToInt32:
      case ReinterpretFloat32:
      case TruncSFloat32ToInt64:
      case TruncUFloat32ToInt64:
      case TruncSFloat64ToInt64:
      case TruncUFloat64ToInt64:
      case ReinterpretFloat64:
      case ReinterpretInt32:
      case ConvertSInt32ToFloat32:
      case ConvertUInt32ToFloat32:
      case ConvertSInt64ToFloat32:
      case ConvertUInt64ToFloat32:
      case ReinterpretInt64:
      case ConvertSInt32ToFloat64:
      case ConvertUInt32ToFloat64:
      case ConvertSInt64ToFloat64:
      case ConvertUInt64ToFloat64:
      case ExtendS8Int32:
      case ExtendS16Int32:
      case ExtendS8Int64:
      case ExtendS16Int64:
      case ExtendS32Int64:
      case TruncSatSFloat32ToInt32:
      case TruncSatUFloat32ToInt32:
      case TruncSatSFloat64ToInt32:
      case TruncSatUFloat64ToInt32:
      case TruncSatSFloat32ToInt64:
      case TruncSatUFloat32ToInt64:
      case TruncSatSFloat64ToInt64:
      case TruncSatUFloat64ToInt64:
        ret = 1;
        break;
      case SqrtFloat32:
      case SqrtFloat64:
        ret = 2;
        break;
      case SplatVecI8x16:
      case SplatVecI16x8:
      case SplatVecI32x4:
      case SplatVecI64x2:
      case SplatVecF16x8:
      case SplatVecF32x4:
      case SplatVecF64x2:
      case NotVec128:
      case AnyTrueVec128:
      case AbsVecI8x16:
      case NegVecI8x16:
      case AllTrueVecI8x16:
      case BitmaskVecI8x16:
      case PopcntVecI8x16:
      case AbsVecI16x8:
      case NegVecI16x8:
      case AllTrueVecI16x8:
      case BitmaskVecI16x8:
      case AbsVecI32x4:
      case NegVecI32x4:
      case AllTrueVecI32x4:
      case BitmaskVecI32x4:
      case AbsVecI64x2:
      case NegVecI64x2:
      case AllTrueVecI64x2:
      case BitmaskVecI64x2:
      case AbsVecF16x8:
      case NegVecF16x8:
      case SqrtVecF16x8:
      case CeilVecF16x8:
      case FloorVecF16x8:
      case TruncVecF16x8:
      case NearestVecF16x8:
      case AbsVecF32x4:
      case NegVecF32x4:
      case SqrtVecF32x4:
      case CeilVecF32x4:
      case FloorVecF32x4:
      case TruncVecF32x4:
      case NearestVecF32x4:
      case AbsVecF64x2:
      case NegVecF64x2:
      case SqrtVecF64x2:
      case CeilVecF64x2:
      case FloorVecF64x2:
      case TruncVecF64x2:
      case NearestVecF64x2:
      case ExtAddPairwiseSVecI8x16ToI16x8:
      case ExtAddPairwiseUVecI8x16ToI16x8:
      case ExtAddPairwiseSVecI16x8ToI32x4:
      case ExtAddPairwiseUVecI16x8ToI32x4:
      case TruncSatSVecF32x4ToVecI32x4:
      case TruncSatUVecF32x4ToVecI32x4:
      case ConvertSVecI32x4ToVecF32x4:
      case ConvertUVecI32x4ToVecF32x4:
      case ExtendLowSVecI8x16ToVecI16x8:
      case ExtendHighSVecI8x16ToVecI16x8:
      case ExtendLowUVecI8x16ToVecI16x8:
      case ExtendHighUVecI8x16ToVecI16x8:
      case ExtendLowSVecI16x8ToVecI32x4:
      case ExtendHighSVecI16x8ToVecI32x4:
      case ExtendLowUVecI16x8ToVecI32x4:
      case ExtendHighUVecI16x8ToVecI32x4:
      case ExtendLowSVecI32x4ToVecI64x2:
      case ExtendHighSVecI32x4ToVecI64x2:
      case ExtendLowUVecI32x4ToVecI64x2:
      case ExtendHighUVecI32x4ToVecI64x2:
      case ConvertLowSVecI32x4ToVecF64x2:
      case ConvertLowUVecI32x4ToVecF64x2:
      case TruncSatZeroSVecF64x2ToVecI32x4:
      case TruncSatZeroUVecF64x2ToVecI32x4:
      case DemoteZeroVecF64x2ToVecF32x4:
      case PromoteLowVecF32x4ToVecF64x2:
      case RelaxedTruncSVecF32x4ToVecI32x4:
      case RelaxedTruncUVecF32x4ToVecI32x4:
      case RelaxedTruncZeroSVecF64x2ToVecI32x4:
      case RelaxedTruncZeroUVecF64x2ToVecI32x4:
      case TruncSatSVecF16x8ToVecI16x8:
      case TruncSatUVecF16x8ToVecI16x8:
      case ConvertSVecI16x8ToVecF16x8:
      case ConvertUVecI16x8ToVecF16x8:
        ret = 1;
        break;
      case InvalidUnary:
        WASM_UNREACHABLE("invalid unary op");
    }
    return ret + visit(curr->value);
  }